

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FourCC FVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Chunk ch;
  vector<char,_std::allocator<char>_> buffer;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  ifstream stream;
  allocator_type local_261;
  Chunk local_260;
  vector<char,_std::allocator<char>_> local_258;
  Chunk local_238;
  Chunk local_230;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> local_228;
  undefined1 local_210 [520];
  
  std::ifstream::ifstream(local_210,"minimal_2.riff",_S_bin);
  riffcpp::Chunk::Chunk(&local_260,"minimal_2.riff");
  local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FVar1 = riffcpp::Chunk::id(&local_260);
  if (FVar1._M_elems == (_Type)0x46464952) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (",0x1d);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
    FVar1 = riffcpp::Chunk::type(&local_260);
    if (FVar1._M_elems == (_Type)0x6c706d73) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ch.type() == smpl_id (",0x16);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
      riffcpp::Chunk::begin(&local_230,SUB81(&local_260,0));
      riffcpp::Chunk::end(&local_238);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&local_228,
                 (iterator *)&local_230,(iterator *)&local_238,&local_261);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_238);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_230);
      if ((long)local_228.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_228.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"chunks.size() == 2 (",0x14);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
        FVar1 = riffcpp::Chunk::id(local_228.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (FVar1._M_elems == (_Type)0x31747374) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"chunks[0].id() == tst1_id (",0x1b);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
          uVar2 = riffcpp::Chunk::size
                            (local_228.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          std::vector<char,_std::allocator<char>_>::resize(&local_258,(ulong)uVar2);
          riffcpp::Chunk::read_data
                    (local_228.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          if ((long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"buffer.size() == 1 (",0x14);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
            if (*local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (",0x22);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
              FVar1 = riffcpp::Chunk::id(local_228.
                                         super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1);
              if (FVar1._M_elems == (_Type)0x32747374) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"chunks[1].id() == tst2_id (",0x1b);
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
                uVar2 = riffcpp::Chunk::size
                                  (local_228.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
                std::vector<char,_std::allocator<char>_>::resize(&local_258,(ulong)uVar2);
                riffcpp::Chunk::read_data
                          (local_228.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1,
                           local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                if ((long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"buffer.size() == 1 (",0x14);
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
                  if (*local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start == -0x12) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xEE (",0x22);
                    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): OK\n",6);
                    std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
                              (&local_228);
                    if (local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start != (char *)0x0) {
                      operator_delete(local_258.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_258.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage -
                                      (long)local_258.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_start);
                    }
                    riffcpp::Chunk::~Chunk(&local_260);
                    std::ifstream::~ifstream(local_210);
                    return 0;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,": (unsigned char)buffer[0] == 0xEE\n",0x23);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,"Subchunk must contain \'0xFF\'",0x1c);
                  std::operator<<(poVar3,'\n');
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,": buffer.size() == 1\n",0x15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,"Subchunk must have data size 1",0x1e);
                  std::operator<<(poVar3,'\n');
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,": chunks[1].id() == tst2_id\n",0x1c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,"Subchunk must have \'tst2\' id",0x1c);
                std::operator<<(poVar3,'\n');
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,": (unsigned char)buffer[0] == 0xFF\n",0x23);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"Subchunk must contain \'0xFF\'",0x1c);
              std::operator<<(poVar3,'\n');
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,": buffer.size() == 1\n",0x15)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"Subchunk must have data size 1",0x1e);
            std::operator<<(poVar3,'\n');
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,": chunks[0].id() == tst1_id\n",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Subchunk must have \'tst1\' id",0x1c);
          std::operator<<(poVar3,'\n');
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": chunks.size() == 2\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Toplevel chunk must contain two subchunks",0x29);
        std::operator<<(poVar3,'\n');
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ch.type() == smpl_id\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Expected \'smpl\' chunk",0x15);
      std::operator<<(poVar3,'\n');
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,": ch.id() == riffcpp::riff_id\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reason: ",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Toplevel \'RIFF\' id expected",0x1b);
    std::operator<<(poVar3,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  std::ifstream stream("minimal_2.riff", std::ios::binary);
  riffcpp::Chunk ch("minimal_2.riff");
  std::vector<char> buffer;
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == tst1_id, "Subchunk must have 'tst1' id");
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");

  TEST_ASSERT(chunks[1].id() == tst2_id, "Subchunk must have 'tst2' id");
  buffer.resize(chunks[1].size());
  chunks[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xEE, "Subchunk must contain '0xFF'");
}